

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O1

TProb<double> * __thiscall
libDAI::TProb<double>::log0(TProb<double> *__return_storage_ptr__,TProb<double> *this)

{
  double __x;
  iterator __position;
  double in_RAX;
  pointer pdVar1;
  ulong uVar2;
  double dVar3;
  double local_28;
  
  (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = in_RAX;
  std::vector<double,_std::allocator<double>_>::reserve
            (&__return_storage_ptr__->_p,
             (long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  pdVar1 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish != pdVar1) {
    uVar2 = 0;
    do {
      __x = pdVar1[uVar2];
      dVar3 = 0.0;
      if ((__x != 0.0) || (NAN(__x))) {
        dVar3 = ::log(__x);
      }
      __position._M_current =
           (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_28 = dVar3;
      if (__position._M_current ==
          (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&__return_storage_ptr__->_p,__position,&local_28);
      }
      else {
        *__position._M_current = dVar3;
        (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar2 = uVar2 + 1;
      pdVar1 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->_p).super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

TProb<T> log0() const {
                TProb<T> l0;
                l0._p.reserve( size() );
                for( size_t i = 0; i < size(); i++ )
                    l0._p.push_back( (_p[i] == 0.0) ? 0.0 : std::log( _p[i] ) );
                return l0;
            }